

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O0

BOOL InitDirectSound(void)

{
  BOOL BVar1;
  int local_10;
  BOOL local_9;
  int i;
  
  audio_backend_initialised = AudioBackend_Init();
  if (audio_backend_initialised) {
    for (local_10 = 0; local_10 < 0xa0; local_10 = local_10 + 1) {
      lpSECONDARYBUFFER[local_10] = (AudioBackend_Sound *)0x0;
    }
    BVar1 = StartOrganya("Wave.dat");
    if (BVar1) {
      local_9 = true;
    }
    else {
      local_9 = false;
    }
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

BOOL InitDirectSound(void)
{
	int i;

	audio_backend_initialised = AudioBackend_Init();

	if (!audio_backend_initialised)
		return FALSE;

	for (i = 0; i < SE_MAX; i++)
		lpSECONDARYBUFFER[i] = NULL;

	if (!StartOrganya("Wave.dat"))
		return FALSE;

	return TRUE;
}